

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Response *
kj::_::convertToReturn<kj::HttpInputStream::Response>
          (Response *__return_storage_ptr__,ExceptionOr<kj::HttpInputStream::Response> *result)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  HttpHeaders *pHVar4;
  AsyncInputStream *pAVar5;
  Exception *exception_1;
  
  bVar1 = (result->super_ExceptionOrValue).exception.ptr.isSet;
  if ((result->value).ptr.isSet == true) {
    if (bVar1 != false) {
      throwRecoverableException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
    }
    uVar2 = *(undefined8 *)&(result->value).ptr.field_1;
    pcVar3 = (result->value).ptr.field_1.value.statusText.content.ptr;
    pHVar4 = (result->value).ptr.field_1.value.headers;
    (__return_storage_ptr__->statusText).content.size_ =
         (result->value).ptr.field_1.value.statusText.content.size_;
    __return_storage_ptr__->headers = pHVar4;
    *(undefined8 *)__return_storage_ptr__ = uVar2;
    (__return_storage_ptr__->statusText).content.ptr = pcVar3;
    pAVar5 = (result->value).ptr.field_1.value.body.ptr;
    (__return_storage_ptr__->body).disposer = (result->value).ptr.field_1.value.body.disposer;
    (__return_storage_ptr__->body).ptr = pAVar5;
    (result->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
    return __return_storage_ptr__;
  }
  if (bVar1 != false) {
    throwFatalException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }